

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t local_88;
  wchar_t effect_index_1;
  wchar_t local_78;
  wchar_t effect_index;
  wchar_t i;
  wchar_t val;
  wchar_t ac;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t wStack_40;
  wchar_t color_offset;
  loc_conflict p;
  ui_entry_details *details_local;
  wchar_t n_local;
  wchar_t *auxvals_local;
  wchar_t *vals_local;
  wchar_t nlabel_local;
  wchar_t *label_local;
  
  _wStack_40 = details->value_position;
  combiner.vec_func._4_4_ = 0;
  if ((details->alternate_color_first & 1U) != 0) {
    combiner.vec_func._4_4_ = 7;
  }
  effect_index = L'd';
  if (((info->ncolors < L'\a') || (info->nlabcolors < L'\a')) || (info->nsym < L'\a')) {
    __assert_fail("info->ncolors >= 7 && info->nlabcolors >= 7 && info->nsym >= 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                  ,0x2e3,
                  "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  iVar1 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&ac);
  if (iVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                  ,0x2e6,
                  "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  for (local_78 = L'\0'; local_78 < n; local_78 = local_78 + L'\x01') {
    if (vals[local_78] < L'É') {
      if (auxvals[local_78] < L'É') {
        effect_index = (vals[local_78] * auxvals[local_78]) / 100;
      }
      else {
        effect_index = auxvals[local_78];
      }
    }
    else {
      effect_index = vals[local_78];
    }
    wVar2 = convert_fa_res_level(effect_index);
    if ((wVar2 < L'\0') || (L'\x06' < wVar2)) {
      __assert_fail("effect_index >= 0 && effect_index < 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                    ,0x2f6,
                    "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                   );
    }
    Term_putch(wStack_40,color_offset,info->colors[wVar2 + combiner.vec_func._4_4_],
               info->symbols[wVar2]);
    _wStack_40 = (loc_conflict)loc_sum((loc)_wStack_40,(loc)details->position_step);
    combiner.vec_func._4_4_ = combiner.vec_func._4_4_ ^ 7;
  }
  if ((L'\0' < nlabel) || ((details->show_combined & 1U) != 0)) {
    (*combiner.finish_func)((ui_entry_combiner_state_conflict *)n);
    if (L'\0' < nlabel) {
      local_88 = L'\0';
      if ((details->known_rune & 1U) != 0) {
        if (val < L'É') {
          if (i < L'É') {
            effect_index = (val * i) / 100;
          }
          else {
            effect_index = i;
          }
        }
        else {
          effect_index = val;
        }
        local_88 = convert_fa_res_level(effect_index);
        if ((local_88 < L'\0') || (L'\x06' < local_88)) {
          __assert_fail("effect_index >= 0 && effect_index < 7",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                        ,0x314,
                        "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                       );
        }
      }
      if ((details->vertical_label & 1U) == 0) {
        safe_queue_chars((details->label_position).x,(details->label_position).y,nlabel,
                         info->label_colors[local_88],label);
      }
      else {
        _wStack_40 = details->label_position;
        for (local_78 = L'\0'; local_78 < nlabel; local_78 = local_78 + L'\x01') {
          Term_putch(wStack_40,color_offset,info->label_colors[local_88],label[local_78]);
          color_offset = color_offset + L'\x01';
        }
      }
    }
    if ((details->show_combined & 1U) != 0) {
      show_combined_generic(info,details,effect_index,effect_index);
    }
  }
  return;
}

Assistant:

static void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac, val = RES_LEVEL_BASE;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 7 && info->nlabcolors >= 7 &&
		info->nsym >= 7);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < n; ++i) {
		int effect_index;
		/* Hack - this should be rewritten without aux - NRM */
		val = RES_LEVEL_BASE;

		if (vals[i] > RES_LEVEL_MIN) {
			val = vals[i];
		} else if (auxvals[i] > RES_LEVEL_MIN) {
			val = auxvals[i];
		} else {
			val = (vals[i] * auxvals[i]) / RES_LEVEL_BASE;
		}
		effect_index = convert_fa_res_level(val);

		assert(effect_index >= 0 && effect_index < 7);
		Term_putch(p.x, p.y,
			info->colors[effect_index + color_offset],
			info->symbols[effect_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 7;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int effect_index = 0;

		if (details->known_rune) {
			/* Hack - this should be rewritten without aux - NRM */
			val = RES_LEVEL_BASE;

			if (vc > RES_LEVEL_MIN) {
				val = vc;
			} else if (ac > RES_LEVEL_MIN) {
				val = ac;
			} else {
				val = (vc * ac) / RES_LEVEL_BASE;
			}
			effect_index = convert_fa_res_level(val);

			assert(effect_index >= 0 && effect_index < 7);
		}

		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[effect_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[effect_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, val, val);
	}
}